

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.hpp
# Opt level: O0

void __thiscall
qclab::qgates::QControlledGate2<double>::setControlState
          (QControlledGate2<double> *this,int controlState)

{
  bool local_15;
  int controlState_local;
  QControlledGate2<double> *this_local;
  
  local_15 = 1 < (uint)controlState;
  if (local_15) {
    __assert_fail("( controlState == 0 ) || ( controlState == 1 )",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QControlledGate2.hpp"
                  ,0x8e,
                  "void qclab::qgates::QControlledGate2<double>::setControlState(const int) [T = double]"
                 );
  }
  this->controlState_ = controlState;
  return;
}

Assistant:

QControlledGate2( const int control , const int controlState = 1 )
        : control_( control )
        , controlState_( controlState )
        {
          assert( control >= 0 ) ;
          assert( ( controlState == 0 ) || ( controlState == 1 ) ) ;
        }